

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

FILE * cimg_library::cimg::output(FILE *file)

{
  int iVar1;
  FILE *file_local;
  
  mutex(1,1);
  if (output(_IO_FILE*)::res == '\0') {
    iVar1 = __cxa_guard_acquire(&output(_IO_FILE*)::res);
    if (iVar1 != 0) {
      output::res = _stderr;
      __cxa_guard_release(&output(_IO_FILE*)::res);
    }
  }
  if (file != (FILE *)0x0) {
    output::res = file;
  }
  mutex(1,0);
  return output::res;
}

Assistant:

inline std::FILE* output(std::FILE *file) {
      cimg::mutex(1);
      static std::FILE *res = stderr;
      if (file) res = file;
      cimg::mutex(1,0);
      return res;
    }